

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O3

int __thiscall Clique::init(Clique *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  ulong uVar3;
  alignment_set_t *paVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  AlignmentRecord *this_00;
  
  this->alignment_count = 0;
  paVar4 = this->alignment_set;
  if (paVar4->m_num_bits != 0) {
    iVar6 = 0;
    uVar7 = 0;
    do {
      if (((paVar4->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0) {
        iVar1 = (*this->parent->_vptr_CliqueFinder[5])(this->parent,uVar7);
        this_00 = (AlignmentRecord *)CONCAT44(extraout_var,iVar1);
        uVar2 = AlignmentRecord::getIntervalStart(this_00);
        uVar3 = (ulong)uVar2;
        if (iVar6 == 0) {
          this->leftmost_segment_start = uVar3;
          uVar2 = AlignmentRecord::getIntervalEnd(this_00);
          uVar3 = (ulong)uVar2;
        }
        else {
          uVar5 = this->leftmost_segment_start;
          if (uVar3 <= this->leftmost_segment_start) {
            uVar5 = uVar3;
          }
          this->leftmost_segment_start = uVar5;
          uVar2 = AlignmentRecord::getIntervalEnd(this_00);
          uVar3 = this->rightmost_segment_end;
          if (this->rightmost_segment_end <= (ulong)uVar2) {
            uVar3 = (ulong)uVar2;
          }
        }
        iVar6 = iVar6 + 1;
        this->rightmost_segment_end = uVar3;
        this->alignment_count = this->alignment_count + 1;
        paVar4 = this->alignment_set;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < paVar4->m_num_bits);
  }
  return (int)paVar4;
}

Assistant:

void Clique::init() {
	int n = 0;
	alignment_count = 0;
	// for (size_t i=alignment_set->find_first(); i!=alignment_set_t::npos; i=alignment_set->find_next(i)) {
	for (size_t i=0; i<alignment_set->size(); ++i) {
		if (!alignment_set->test(i)) continue;
		const AlignmentRecord& ap = parent.getAlignmentByIndex(i);
		if (n++==0) {
			leftmost_segment_start = ap.getIntervalStart();
			rightmost_segment_end = ap.getIntervalEnd();
		} else {
			leftmost_segment_start = min(leftmost_segment_start, (size_t)ap.getIntervalStart());
			rightmost_segment_end = max(rightmost_segment_end, (size_t)ap.getIntervalEnd());
		}
		alignment_count += 1;
	}
}